

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_constant_names_generated.c
# Opt level: O2

char * psa_ka_algorithm_name(psa_algorithm_t ka_alg)

{
  if (ka_alg == 0x30000000) {
    return "PSA_ALG_CATEGORY_KEY_AGREEMENT";
  }
  if (ka_alg != 0x30100000) {
    if (ka_alg == 0x30200000) {
      return "PSA_ALG_ECDH";
    }
    return (char *)0x0;
  }
  return "PSA_ALG_FFDH";
}

Assistant:

static const char *psa_ka_algorithm_name(psa_algorithm_t ka_alg)
{
    switch (ka_alg) {
    case PSA_ALG_CATEGORY_KEY_AGREEMENT: return "PSA_ALG_CATEGORY_KEY_AGREEMENT";
    case PSA_ALG_ECDH: return "PSA_ALG_ECDH";
    case PSA_ALG_FFDH: return "PSA_ALG_FFDH";
    default: return NULL;
    }
}